

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>::emplaceValue<QList<QCss::StyleRule>>
          (Node<QObject_const*,QList<QCss::StyleRule>> *this,QList<QCss::StyleRule> *args)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QCss::StyleRule> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (args->d).d;
  local_28.ptr = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (StyleRule *)0x0;
  local_28.size = (args->d).size;
  (args->d).size = 0;
  QArrayDataPointer<QCss::StyleRule>::operator=
            ((QArrayDataPointer<QCss::StyleRule> *)(this + 8),&local_28);
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }